

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

char * __thiscall
google::protobuf::OneofDescriptorProto::_InternalParse
          (OneofDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  Arena *this_00;
  EpsCopyInputStream *in_RDX;
  char *in_RSI;
  ParseContext *in_RDI;
  uint32 tag;
  Arena *arena;
  HasBits has_bits;
  EpsCopyInputStream *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  HasBits<1UL> in_stack_ffffffffffffffd4;
  EpsCopyInputStream *pEVar2;
  char *local_20;
  
  memset(&stack0xffffffffffffffd4,0,4);
  this_00 = GetArenaNoVirtual((OneofDescriptorProto *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  local_20 = in_RSI;
  do {
    while( true ) {
      bVar1 = internal::ParseContext::Done
                        ((ParseContext *)
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         &in_stack_ffffffffffffffa8->limit_end_);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_004fbb94;
      local_20 = internal::ReadTag((char *)in_RDX,
                                   (uint32 *)
                                   CONCAT44(in_stack_ffffffffffffffd4.has_bits_[0],
                                            in_stack_ffffffffffffffd0),
                                   (uint32)((ulong)this_00 >> 0x20));
      if (local_20 == (char *)0x0) goto LAB_004fbbb1;
      in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffc4 >> 3;
      if (in_stack_ffffffffffffffb4 != 1) break;
      if ((in_stack_ffffffffffffffc4 & 0xff) == 10) {
        _internal_mutable_name_abi_cxx11_
                  ((OneofDescriptorProto *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        local_20 = internal::InlineGreedyStringParserUTF8Verify
                             ((string *)
                              CONCAT44(in_stack_ffffffffffffffd4.has_bits_[0],
                                       in_stack_ffffffffffffffd0),(char *)this_00,
                              (ParseContext *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              (char *)in_RDI);
      }
      else {
LAB_004fbb36:
        if (((in_stack_ffffffffffffffc4 & 7) == 4) || (in_stack_ffffffffffffffc4 == 0)) {
          internal::EpsCopyInputStream::SetLastTag(in_RDX,in_stack_ffffffffffffffc4);
          goto LAB_004fbb94;
        }
        local_20 = internal::UnknownFieldParse
                             ((uint32)in_stack_ffffffffffffffd4.has_bits_[0],
                              (InternalMetadataWithArena *)this_00,
                              (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              in_RDI);
      }
      if (local_20 == (char *)0x0) goto LAB_004fbbb1;
    }
    if ((in_stack_ffffffffffffffb4 != 2) || ((in_stack_ffffffffffffffc4 & 0xff) != 0x12))
    goto LAB_004fbb36;
    pEVar2 = in_RDX;
    _internal_mutable_options((OneofDescriptorProto *)CONCAT44(2,in_stack_ffffffffffffffb0));
    local_20 = internal::ParseContext::ParseMessage<google::protobuf::OneofOptions>
                         ((ParseContext *)this_00,
                          (OneofOptions *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          (char *)in_RDI);
    in_stack_ffffffffffffffa8 = in_RDX;
    in_RDX = pEVar2;
  } while (local_20 != (char *)0x0);
LAB_004fbbb1:
  local_20 = (char *)0x0;
LAB_004fbb94:
  internal::HasBits<1UL>::Or
            ((HasBits<1UL> *)&(in_RDI->super_EpsCopyInputStream).next_chunk_,
             (HasBits<1UL> *)&stack0xffffffffffffffd4);
  return local_20;
}

Assistant:

const char* OneofDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.OneofDescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.OneofOptions options = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}